

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block_graph.cpp
# Opt level: O0

IRT * __thiscall IRT::getBlockLabel_abi_cxx11_(IRT *this,CStatementList *basicBlock)

{
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  *pvVar1;
  size_type sVar2;
  const_reference this_00;
  CLabelStatement *local_78;
  CLabel local_48;
  CLabelStatement *local_28;
  CLabelStatement *label;
  CStatement *firstStm;
  CStatementList *basicBlock_local;
  
  firstStm = &basicBlock->super_CStatement;
  basicBlock_local = (CStatementList *)this;
  if (basicBlock == (CStatementList *)0x0) {
    __assert_fail("basicBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x40,"std::string IRT::getBlockLabel(const CStatementList *)");
  }
  pvVar1 = CStatementList::Statements(basicBlock);
  sVar2 = std::
          vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
          ::size(pvVar1);
  if (sVar2 != 0) {
    pvVar1 = CStatementList::Statements((CStatementList *)firstStm);
    this_00 = std::
              vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              ::front(pvVar1);
    label = (CLabelStatement *)
            std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::get
                      (this_00);
    if (label == (CLabelStatement *)0x0) {
      local_78 = (CLabelStatement *)0x0;
    }
    else {
      local_78 = (CLabelStatement *)
                 __dynamic_cast(label,&CStatement::typeinfo,&CLabelStatement::typeinfo,0);
    }
    local_28 = local_78;
    if (local_78 != (CLabelStatement *)0x0) {
      CLabelStatement::Label(&local_48,local_78);
      CLabel::ToString_abi_cxx11_((CLabel *)this);
      CLabel::~CLabel(&local_48);
      return this;
    }
    __assert_fail("label != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                  ,0x44,"std::string IRT::getBlockLabel(const CStatementList *)");
  }
  __assert_fail("basicBlock->Statements().size() != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/basic_blocks/basic_block_graph.cpp"
                ,0x41,"std::string IRT::getBlockLabel(const CStatementList *)");
}

Assistant:

std::string getBlockLabel(const CStatementList *basicBlock) {
        assert(basicBlock != nullptr);
        assert(basicBlock->Statements().size() != 0);
        const CStatement* firstStm = basicBlock->Statements().front().get();
        const CLabelStatement* label = dynamic_cast<const CLabelStatement*>(firstStm);
        assert(label != nullptr);

        return label->Label().ToString();
    }